

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

_Bool ppc_pvr_match_power8(PowerPCCPUClass_conflict1 *pcc,uint32_t pvr)

{
  _Bool _Var1;
  uint uVar2;
  
  uVar2 = pvr & 0xffff0000;
  _Var1 = true;
  if (((uVar2 != 0x4b0000) && (uVar2 != 0x4c0000)) && (uVar2 != 0x4d0000)) {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool ppc_pvr_match_power8(PowerPCCPUClass *pcc, uint32_t pvr)
{
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8NVL_BASE) {
        return true;
    }
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8E_BASE) {
        return true;
    }
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8_BASE) {
        return true;
    }
    return false;
}